

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O0

int __thiscall PyServerDMLSession::close(PyServerDMLSession *this,int __fd)

{
  bool bVar1;
  uint local_4c;
  object local_48;
  object o;
  handle local_30;
  function overload;
  gil_scoped_acquire gil;
  SessionCloseErrorCode error_local;
  PyServerDMLSession *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<ki::protocol::net::ServerDMLSession>
            ((pybind11 *)&local_30,&this->super_ServerDMLSession,"close");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_30);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_48,(SessionCloseErrorCode *)&local_30);
    pybind11::detail::cast_safe<void>(&local_48);
    pybind11::object::~object(&local_48);
  }
  local_4c = (uint)bVar1;
  pybind11::function::~function((function *)&local_30);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (local_4c == 0) {
    pybind11::pybind11_fail
              ("Tried to call pure virtual function \"ki::protocol::net::ServerDMLSession::close\"")
    ;
  }
  return local_4c;
}

Assistant:

void close(ki::protocol::net::SessionCloseErrorCode error) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ServerDMLSession,
            close, error);
    }